

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O3

void __thiscall LoadTable::saveXml(LoadTable *this,ostream *s)

{
  AddrSpace *pAVar1;
  ostream *poVar2;
  char local_49;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<loadtable",10);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"size","");
  local_49 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_49,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"num","");
  local_49 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_49,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n  ",4);
  std::__ostream_insert<char,std::char_traits<char>>(s,"<addr",5);
  pAVar1 = (this->addr).base;
  if (pAVar1 != (AddrSpace *)0x0) {
    (*pAVar1->_vptr_AddrSpace[7])(pAVar1,s,(this->addr).offset);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>",2);
  std::__ostream_insert<char,std::char_traits<char>>(s,"</loadtable>\n",0xd);
  return;
}

Assistant:

void LoadTable::saveXml(ostream &s) const

{
  s << "<loadtable";
  a_v_i(s,"size",size);
  a_v_i(s,"num",num);
  s << ">\n  ";
  addr.saveXml(s);
  s << "</loadtable>\n";
}